

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::IsPathToMacOSSharedLibrary(string *path)

{
  bool bVar1;
  int iVar2;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  bVar1 = cmsys::SystemTools::FileIsFullPath(path);
  if (bVar1) {
    local_18._M_str = (path->_M_dataplus)._M_p;
    local_18._M_len = path->_M_string_length;
    if (5 < local_18._M_len) {
      __str._M_str = ".dylib";
      __str._M_len = 6;
      iVar2 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        (&local_18,local_18._M_len - 6,6,__str);
      return iVar2 == 0;
    }
  }
  return false;
}

Assistant:

bool cmSystemTools::IsPathToMacOSSharedLibrary(const std::string& path)
{
  return (cmSystemTools::FileIsFullPath(path) &&
          cmHasLiteralSuffix(path, ".dylib"));
}